

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void __thiscall
duckdb::RLECompressState<duckdb::uhugeint_t,_true>::WriteValue
          (RLECompressState<duckdb::uhugeint_t,_true> *this,uhugeint_t value,rle_count_t count,
          bool is_null)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  idx_t iVar4;
  __int_type _Var5;
  uint64_t uVar6;
  bool bVar7;
  pointer pCVar8;
  long lVar9;
  uhugeint_t *rhs;
  undefined3 in_register_00000081;
  uhugeint_t *this_01;
  uhugeint_t local_40;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar2 = ((this->handle).node.ptr)->buffer;
  iVar3 = this->max_rle_count;
  lVar9 = this->entry_count * 0x10;
  *(uint64_t *)(pdVar2 + lVar9 + 8) = value.lower;
  *(uint64_t *)(pdVar2 + lVar9 + 0x10) = value.upper;
  iVar4 = this->entry_count;
  *(rle_count_t *)(pdVar2 + iVar4 * 2 + iVar3 * 0x10 + 8) = count;
  this->entry_count = iVar4 + 1;
  if (CONCAT31(in_register_00000081,is_null) == 0) {
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    this_01 = (uhugeint_t *)&(pCVar8->stats).statistics.stats_union.numeric_data.min;
    rhs = (uhugeint_t *)&(pCVar8->stats).statistics.stats_union.numeric_data.max;
    local_40.lower = value.lower;
    local_40.upper = value.upper;
    bVar7 = uhugeint_t::operator>(this_01,&local_40);
    if (bVar7) {
      this_01 = &local_40;
    }
    uVar6 = this_01->upper;
    *(uint64_t *)((long)&(pCVar8->stats).statistics.stats_union + 8) = this_01->lower;
    *(uint64_t *)((long)&(pCVar8->stats).statistics.stats_union + 0x10) = uVar6;
    bVar7 = uhugeint_t::operator>(&local_40,rhs);
    if (bVar7) {
      rhs = &local_40;
    }
    uVar6 = rhs->upper;
    *(uint64_t *)((long)&(pCVar8->stats).statistics.stats_union + 0x18) = rhs->lower;
    *(uint64_t *)((long)&(pCVar8->stats).statistics.stats_union + 0x20) = uVar6;
  }
  this_00 = &this->current_segment;
  pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  LOCK();
  paVar1 = &(pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + (ulong)count;
  UNLOCK();
  if (this->entry_count == this->max_rle_count) {
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    iVar3 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    _Var5 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var5 + iVar3);
    this->entry_count = 0;
  }
  return;
}

Assistant:

void WriteValue(T value, rle_count_t count, bool is_null) {
		// write the RLE entry
		auto handle_ptr = handle.Ptr() + RLEConstants::RLE_HEADER_SIZE;
		auto data_pointer = reinterpret_cast<T *>(handle_ptr);
		auto index_pointer = reinterpret_cast<rle_count_t *>(handle_ptr + max_rle_count * sizeof(T));
		data_pointer[entry_count] = value;
		index_pointer[entry_count] = count;
		entry_count++;

		// update meta data
		if (WRITE_STATISTICS && !is_null) {
			current_segment->stats.statistics.UpdateNumericStats<T>(value);
		}
		current_segment->count += count;

		if (entry_count == max_rle_count) {
			// we have finished writing this segment: flush it and create a new segment
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
			entry_count = 0;
		}
	}